

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

method_info * __thiscall
Frame::getMethodNamed(Frame *this,ClassRuntime *classRuntime,string *name,string *descriptor)

{
  method_info *pmVar1;
  bool bVar2;
  int iVar3;
  ClassFile *pCVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  string methodName;
  string methodDesc;
  allocator local_a9;
  string *local_a8;
  string *local_a0;
  string local_98;
  MethodArea *local_78;
  method_info *local_70;
  Frame *local_68;
  ClassRuntime *local_60;
  ClassFile *local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_a8 = descriptor;
  local_a0 = name;
  local_68 = this;
  local_78 = MethodArea::getInstance();
  if (classRuntime != (ClassRuntime *)0x0) {
    do {
      pCVar4 = ClassRuntime::getClassFile(classRuntime);
      if (pCVar4->methods_count != 0) {
        lVar7 = 0;
        uVar6 = 0;
        local_60 = classRuntime;
        local_58 = pCVar4;
        do {
          pCVar4 = local_58;
          pmVar1 = local_58->methods;
          pcVar5 = getFormattedConstant
                             (local_58->constant_pool,*(u2 *)((long)&pmVar1->name_index + lVar7));
          std::__cxx11::string::string((string *)&local_98,pcVar5,(allocator *)&local_50);
          pcVar5 = getFormattedConstant
                             (pCVar4->constant_pool,*(u2 *)((long)&pmVar1->descriptor_index + lVar7)
                             );
          std::__cxx11::string::string((string *)&local_50,pcVar5,&local_a9);
          bVar2 = true;
          if (((local_98._M_string_length == local_a0->_M_string_length) &&
              (((local_98._M_string_length == 0 ||
                (iVar3 = bcmp(local_98._M_dataplus._M_p,(local_a0->_M_dataplus)._M_p,
                              local_98._M_string_length), iVar3 == 0)) &&
               (local_48 == local_a8->_M_string_length)))) &&
             ((local_48 == 0 ||
              (iVar3 = bcmp(local_50,(local_a8->_M_dataplus)._M_p,local_48), iVar3 == 0)))) {
            local_70 = (method_info *)((long)&pmVar1->access_flags + lVar7);
            local_68->_classRuntime = local_60;
            bVar2 = false;
          }
          if (local_50 != local_40) {
            operator_delete(local_50);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if (!bVar2) {
            return local_70;
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x10;
          pCVar4 = local_58;
        } while (uVar6 < local_58->methods_count);
      }
      if (pCVar4->super_class == 0) {
        return (method_info *)0x0;
      }
      pcVar5 = getFormattedConstant(pCVar4->constant_pool,pCVar4->super_class);
      std::__cxx11::string::string((string *)&local_98,pcVar5,(allocator *)&local_50);
      classRuntime = MethodArea::loadClassNamed(local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    } while (classRuntime != (ClassRuntime *)0x0);
  }
  return (method_info *)0x0;
}

Assistant:

method_info* Frame::getMethodNamed(ClassRuntime *classRuntime, string name, string descriptor) {
    MethodArea &methodArea = MethodArea::getInstance();
    
    ClassRuntime *currClass = classRuntime;
    method_info *method;
    
    while (currClass != NULL) {
        ClassFile *classFile = currClass->getClassFile();
        
        for (int i = 0; i < classFile->methods_count; i++) {
            method = &(classFile->methods[i]);
            string methodName = getFormattedConstant(classFile->constant_pool, method->name_index);
            string methodDesc = getFormattedConstant(classFile->constant_pool, method->descriptor_index);
            
            if (methodName == name && methodDesc == descriptor) {
                _classRuntime = currClass;
                return method;
            }
        }
        
        // procurando o método nas super classes.
        if (classFile->super_class == 0) {
            currClass = NULL;
        } else {
            string superClassName = getFormattedConstant(classFile->constant_pool, classFile->super_class);
            currClass = methodArea.loadClassNamed(superClassName);
        }
    }
    
    return NULL;
}